

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall
leveldb::VersionSet::Builder::MaybeAddFile(Builder *this,Version *v,int level,FileMetaData *f)

{
  size_type sVar1;
  int *in_RCX;
  int in_EDX;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *in_RSI;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files;
  undefined4 in_stack_ffffffffffffffe8;
  
  sVar1 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::count
                    (in_RSI,(key_type *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  if (sVar1 == 0) {
    if (0 < in_EDX) {
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::empty
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)in_RSI
                );
    }
    *in_RCX = *in_RCX + 1;
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)in_RSI,
               (value_type *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  }
  return;
}

Assistant:

void MaybeAddFile(Version* v, int level, FileMetaData* f) {
    if (levels_[level].deleted_files.count(f->number) > 0) {
      // File is deleted: do nothing
    } else {
      std::vector<FileMetaData*>* files = &v->files_[level];
      if (level > 0 && !files->empty()) {
        // Must not overlap
        assert(vset_->icmp_.Compare((*files)[files->size() - 1]->largest,
                                    f->smallest) < 0);
      }
      f->refs++;
      files->push_back(f);
    }
  }